

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromLoad
          (CopyPropagateArrays *this,Instruction *load_inst)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *this_00;
  DefUseManager *this_01;
  MemoryObject *this_02;
  pointer in_RDX;
  undefined1 local_68 [20];
  undefined4 local_54;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t element_index_id;
  uint32_t i;
  Instruction *current_inst;
  DefUseManager *def_use_mgr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components_in_reverse;
  Instruction *load_inst_local;
  CopyPropagateArrays *this_local;
  
  components_in_reverse.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&def_use_mgr);
  this_00 = Pass::context((Pass *)load_inst);
  this_01 = IRContext::get_def_use_mgr(this_00);
  current_inst = (Instruction *)this_01;
  uVar2 = opt::Instruction::GetSingleWordInOperand
                    ((Instruction *)
                     components_in_reverse.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,0);
  _element_index_id = analysis::DefUseManager::GetDef(this_01,uVar2);
  while( true ) {
    OVar3 = opt::Instruction::opcode(_element_index_id);
    if (OVar3 != OpAccessChain) break;
    local_4c = opt::Instruction::NumInOperands(_element_index_id);
    while (pIVar1 = current_inst, local_4c = local_4c - 1, local_4c != 0) {
      local_50 = opt::Instruction::GetSingleWordInOperand(_element_index_id,local_4c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&def_use_mgr,&local_50);
    }
    uVar2 = opt::Instruction::GetSingleWordInOperand(_element_index_id,0);
    _element_index_id = analysis::DefUseManager::GetDef((DefUseManager *)pIVar1,uVar2);
  }
  OVar3 = opt::Instruction::opcode(_element_index_id);
  if (OVar3 == OpVariable) {
    this_02 = (MemoryObject *)::operator_new(0x20);
    pIVar1 = _element_index_id;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    MemoryObject::
    MemoryObject<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              (this_02,pIVar1,
               (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)(local_68 + 8),
               (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_68);
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,this_02);
  }
  else {
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,(nullptr_t)0x0);
  }
  local_54 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&def_use_mgr);
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromLoad(Instruction* load_inst) {
  std::vector<uint32_t> components_in_reverse;
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  Instruction* current_inst = def_use_mgr->GetDef(
      load_inst->GetSingleWordInOperand(kLoadPointerInOperand));

  // Build the access chain for the memory object by collecting the indices used
  // in the OpAccessChain instructions.  If we find a variable index, then
  // return |nullptr| because we cannot know for sure which memory location is
  // used.
  //
  // It is built in reverse order because the different |OpAccessChain|
  // instructions are visited in reverse order from which they are applied.
  while (current_inst->opcode() == spv::Op::OpAccessChain) {
    for (uint32_t i = current_inst->NumInOperands() - 1; i >= 1; --i) {
      uint32_t element_index_id = current_inst->GetSingleWordInOperand(i);
      components_in_reverse.push_back(element_index_id);
    }
    current_inst = def_use_mgr->GetDef(current_inst->GetSingleWordInOperand(0));
  }

  // If the address in the load is not constructed from an |OpVariable|
  // instruction followed by a series of |OpAccessChain| instructions, then
  // return |nullptr| because we cannot identify the owner or access chain
  // exactly.
  if (current_inst->opcode() != spv::Op::OpVariable) {
    return nullptr;
  }

  // Build the memory object.  Use |rbegin| and |rend| to put the access chain
  // back in the correct order.
  return std::unique_ptr<CopyPropagateArrays::MemoryObject>(
      new MemoryObject(current_inst, components_in_reverse.rbegin(),
                       components_in_reverse.rend()));
}